

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O0

int fy_parse_strncmp(fy_parser *fyp,char *str,size_t n)

{
  int iVar1;
  char *__s1;
  int ret;
  char *p;
  size_t n_local;
  char *str_local;
  fy_parser *fyp_local;
  
  __s1 = (char *)fy_ensure_lookahead(fyp,n,(size_t *)0x0);
  if (__s1 == (char *)0x0) {
    fyp_local._4_4_ = 0xffffffff;
  }
  else {
    iVar1 = strncmp(__s1,str,n);
    fyp_local._4_4_ = (uint)(iVar1 != 0);
  }
  return fyp_local._4_4_;
}

Assistant:

static inline int fy_parse_strncmp(struct fy_parser *fyp, const char *str, size_t n) {
    const char *p;
    int ret;

    p = fy_ensure_lookahead(fyp, n, NULL);
    if (!p)
        return -1;
    ret = strncmp(p, str, n);
    return ret ? 1 : 0;
}